

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVStreambuf.h
# Opt level: O0

void __thiscall
cmBasicUVStreambuf<char,_std::char_traits<char>_>::~cmBasicUVStreambuf
          (cmBasicUVStreambuf<char,_std::char_traits<char>_> *this)

{
  int in_ESI;
  cmBasicUVStreambuf<char,_std::char_traits<char>_> *this_local;
  
  *(undefined ***)this = &PTR__cmBasicUVStreambuf_011c20f0;
  close(this,in_ESI);
  std::vector<char,_std::allocator<char>_>::~vector(&this->InputBuffer);
  std::streambuf::~streambuf((streambuf *)this);
  return;
}

Assistant:

cmBasicUVStreambuf<CharT, Traits>::~cmBasicUVStreambuf()
{
  this->close();
}